

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

void poly1305_whole_block(void *vctx,uint8_t *buf)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  long lVar7;
  undefined1 auVar8 [16];
  uint32_t c [17];
  uint32_t local_48 [16];
  undefined4 local_8;
  
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)(buf + lVar7);
    uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar5;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar5;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar3._8_5_;
    auVar8._0_4_ = (undefined4)uVar5;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = auVar8._0_4_;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
    auVar8._4_9_ = auVar4._4_9_;
    auVar8._13_3_ = 0;
    *(undefined1 (*) [16])(local_48 + lVar7) = auVar8;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  local_8 = 1;
  poly1305_block((cf_poly1305 *)vctx,local_48);
  return;
}

Assistant:

static void poly1305_whole_block(void *vctx,
                                 const uint8_t *buf)
{
  cf_poly1305 *ctx = vctx;
  uint32_t c[17];
  int i;

  for (i = 0; i < 16; i++)
    c[i] = buf[i];

  c[16] = 1;
  poly1305_block(ctx, c);
}